

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

Abc_Obj_t *
Abc_NtkDsdConstructNode
          (Dsd_Manager_t *pManDsd,Dsd_Node_t *pNodeDsd,Abc_Ntk_t *pNtkNew,int *pCounters)

{
  DdManager *ddDestination;
  Dsd_Type_t DVar1;
  int iVar2;
  int iVar3;
  DdManager *dd;
  Abc_Obj_t *pObj;
  Dsd_Node_t *pDVar4;
  DdNode *pDVar5;
  int local_70;
  int nDecs;
  int i;
  Dsd_Type_t Type;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bLocal;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNodeNew;
  Dsd_Node_t *pFaninDsd;
  DdManager *ddNew;
  DdManager *ddDsd;
  int *pCounters_local;
  Abc_Ntk_t *pNtkNew_local;
  Dsd_Node_t *pNodeDsd_local;
  Dsd_Manager_t *pManDsd_local;
  
  dd = Dsd_ManagerReadDd(pManDsd);
  pObj = Abc_NtkCreateNode(pNtkNew);
  DVar1 = Dsd_NodeReadType(pNodeDsd);
  iVar2 = Dsd_NodeReadDecsNum(pNodeDsd);
  if (iVar2 < 2) {
    __assert_fail("nDecs > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0xe8,
                  "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
                 );
  }
  local_70 = 0;
  while( true ) {
    if (iVar2 <= local_70) {
      ddDestination = (DdManager *)pNtkNew->pManFunc;
      switch(DVar1) {
      case DSD_NODE_CONST1:
        bTemp = ddDestination->one;
        Cudd_Ref(bTemp);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                      ,0x128,
                      "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
                     );
      case DSD_NODE_OR:
        bTemp = (DdNode *)((ulong)ddDestination->one ^ 1);
        Cudd_Ref(bTemp);
        for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
          pDVar4 = Dsd_NodeReadDec(pNodeDsd,local_70);
          pDVar5 = Cudd_bddOr(ddDestination,bTemp,
                              (DdNode *)
                              ((ulong)ddDestination->vars[local_70] ^ (long)(int)((uint)pDVar4 & 1))
                             );
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(ddDestination,bTemp);
          bTemp = pDVar5;
        }
        break;
      case DSD_NODE_EXOR:
        bTemp = (DdNode *)((ulong)ddDestination->one ^ 1);
        Cudd_Ref(bTemp);
        for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
          pDVar5 = Cudd_bddXor(ddDestination,bTemp,ddDestination->vars[local_70]);
          Cudd_Ref(pDVar5);
          Cudd_RecursiveDeref(ddDestination,bTemp);
          bTemp = pDVar5;
        }
        break;
      case DSD_NODE_PRIME:
        if (pCounters != (int *)0x0) {
          if (iVar2 < 10) {
            pCounters[iVar2] = pCounters[iVar2] + 1;
          }
          else {
            pCounters[10] = pCounters[10] + 1;
          }
        }
        pDVar5 = Dsd_TreeGetPrimeFunction(dd,pNodeDsd);
        Cudd_Ref(pDVar5);
        bTemp = Extra_TransferLevelByLevel(dd,ddDestination,pDVar5);
        Cudd_Ref(bTemp);
        Cudd_RecursiveDeref(dd,pDVar5);
      }
      (pObj->field_5).pData = bTemp;
      Dsd_NodeSetMark(pNodeDsd,(int)pObj);
      return pObj;
    }
    pDVar4 = Dsd_NodeReadDec(pNodeDsd,local_70);
    iVar3 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar4 & 0xfffffffffffffffe));
    Abc_ObjAddFanin(pObj,(Abc_Obj_t *)(long)iVar3);
    if ((DVar1 != DSD_NODE_OR) && (((ulong)pDVar4 & 1) != 0)) break;
    local_70 = local_70 + 1;
  }
  __assert_fail("Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                ,0xee,
                "Abc_Obj_t *Abc_NtkDsdConstructNode(Dsd_Manager_t *, Dsd_Node_t *, Abc_Ntk_t *, int *)"
               );
}

Assistant:

Abc_Obj_t * Abc_NtkDsdConstructNode( Dsd_Manager_t * pManDsd, Dsd_Node_t * pNodeDsd, Abc_Ntk_t * pNtkNew, int * pCounters )
{
    DdManager * ddDsd = Dsd_ManagerReadDd( pManDsd );
    DdManager * ddNew = (DdManager *)pNtkNew->pManFunc;
    Dsd_Node_t * pFaninDsd;
    Abc_Obj_t * pNodeNew, * pFanin;
    DdNode * bLocal, * bTemp, * bVar;
    Dsd_Type_t Type;
    int i, nDecs;

    // create the new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins
    Type  = Dsd_NodeReadType( pNodeDsd );
    nDecs = Dsd_NodeReadDecsNum( pNodeDsd );
    assert( nDecs > 1 );
    for ( i = 0; i < nDecs; i++ )
    {
        pFaninDsd  = Dsd_NodeReadDec( pNodeDsd, i );
        pFanin     = (Abc_Obj_t *)(ABC_PTRINT_T)Dsd_NodeReadMark(Dsd_Regular(pFaninDsd));
        Abc_ObjAddFanin( pNodeNew, pFanin );
        assert( Type == DSD_NODE_OR || !Dsd_IsComplement(pFaninDsd) );
    }

    // create the local function depending on the type of the node
    ddNew = (DdManager *)pNtkNew->pManFunc;
    switch ( Type )
    {
        case DSD_NODE_CONST1:
        {
            bLocal = ddNew->one; Cudd_Ref( bLocal );
            break;
        }
        case DSD_NODE_OR:
        {
            bLocal = Cudd_Not(ddNew->one); Cudd_Ref( bLocal );
            for ( i = 0; i < nDecs; i++ )
            {
                pFaninDsd  = Dsd_NodeReadDec( pNodeDsd, i );
                bVar   = Cudd_NotCond( ddNew->vars[i], Dsd_IsComplement(pFaninDsd) );
                bLocal = Cudd_bddOr( ddNew, bTemp = bLocal, bVar );               Cudd_Ref( bLocal );
                Cudd_RecursiveDeref( ddNew, bTemp );
            }
            break;
        }
        case DSD_NODE_EXOR:
        {
            bLocal = Cudd_Not(ddNew->one); Cudd_Ref( bLocal );
            for ( i = 0; i < nDecs; i++ )
            {
                bLocal = Cudd_bddXor( ddNew, bTemp = bLocal, ddNew->vars[i] );    Cudd_Ref( bLocal );
                Cudd_RecursiveDeref( ddNew, bTemp );
            }
            break;
        }
        case DSD_NODE_PRIME:
        {
            if ( pCounters )
            {
                if ( nDecs < 10 )
                    pCounters[nDecs]++;
                else
                    pCounters[10]++;
            }
            bLocal = Dsd_TreeGetPrimeFunction( ddDsd, pNodeDsd );                Cudd_Ref( bLocal );
            bLocal = Extra_TransferLevelByLevel( ddDsd, ddNew, bTemp = bLocal ); Cudd_Ref( bLocal );
/*
if ( nDecs == 3 )
{
Extra_bddPrint( ddDsd, bTemp );
printf( "\n" );
}
*/
            Cudd_RecursiveDeref( ddDsd, bTemp );
            // bLocal is now in the new BDD manager
            break;
        }
        default:
        {
            assert( 0 );
            break;
        }
    }
    pNodeNew->pData = bLocal;
    Dsd_NodeSetMark( pNodeDsd, (int)(ABC_PTRINT_T)pNodeNew );
    return pNodeNew;
}